

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O3

Matrix44<float> * __thiscall Imath_2_5::Matrix44<float>::invert(Matrix44<float> *this,bool singExc)

{
  Matrix44<float> local_58;
  
  inverse(&local_58,this,singExc);
  *(undefined8 *)this->x[0] = local_58.x[0]._0_8_;
  *(undefined8 *)(this->x[0] + 2) = local_58.x[0]._8_8_;
  *(undefined8 *)this->x[1] = local_58.x[1]._0_8_;
  *(undefined8 *)(this->x[1] + 2) = local_58.x[1]._8_8_;
  *(undefined8 *)this->x[2] = local_58.x[2]._0_8_;
  *(undefined8 *)(this->x[2] + 2) = local_58.x[2]._8_8_;
  *(undefined8 *)this->x[3] = local_58.x[3]._0_8_;
  *(undefined8 *)(this->x[3] + 2) = local_58.x[3]._8_8_;
  return this;
}

Assistant:

const Matrix44<T> &
Matrix44<T>::invert (bool singExc)
{
    *this = inverse (singExc);
    return *this;
}